

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_node.c
# Opt level: O0

void NJDNode_sprint(NJDNode *node,char *buff,char *split_code)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  undefined8 in_RDX;
  char *in_RSI;
  NJDNode *in_RDI;
  
  pcVar4 = NJDNode_get_string(in_RDI);
  pcVar5 = NJDNode_get_pos(in_RDI);
  pcVar6 = NJDNode_get_pos_group1(in_RDI);
  pcVar7 = NJDNode_get_pos_group2(in_RDI);
  pcVar8 = NJDNode_get_pos_group3(in_RDI);
  pcVar9 = NJDNode_get_ctype(in_RDI);
  pcVar10 = NJDNode_get_cform(in_RDI);
  pcVar11 = NJDNode_get_orig(in_RDI);
  pcVar12 = NJDNode_get_read(in_RDI);
  pcVar13 = NJDNode_get_pron(in_RDI);
  iVar1 = NJDNode_get_acc(in_RDI);
  iVar2 = NJDNode_get_mora_size(in_RDI);
  pcVar14 = NJDNode_get_chain_rule(in_RDI);
  iVar3 = NJDNode_get_chain_flag(in_RDI);
  sprintf(in_RSI,"%s%s,%s,%s,%s,%s,%s,%s,%s,%s,%s,%d/%d,%s,%d%s",in_RSI,pcVar4,pcVar5,pcVar6,pcVar7,
          pcVar8,pcVar9,pcVar10,pcVar11,pcVar12,pcVar13,iVar1,iVar2,pcVar14,iVar3,in_RDX);
  return;
}

Assistant:

void NJDNode_sprint(NJDNode * node, char *buff, const char *split_code)
{
   sprintf(buff, "%s%s,%s,%s,%s,%s,%s,%s,%s,%s,%s,%d/%d,%s,%d%s", buff, NJDNode_get_string(node),
           NJDNode_get_pos(node), NJDNode_get_pos_group1(node), NJDNode_get_pos_group2(node),
           NJDNode_get_pos_group3(node), NJDNode_get_ctype(node), NJDNode_get_cform(node),
           NJDNode_get_orig(node), NJDNode_get_read(node), NJDNode_get_pron(node),
           NJDNode_get_acc(node), NJDNode_get_mora_size(node), NJDNode_get_chain_rule(node),
           NJDNode_get_chain_flag(node), split_code);
}